

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

char * sha1_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA1_CTX context;
  SHA1_CTX local_88;
  
  local_88.state[0] = 0x67452301;
  local_88.state[1] = 0xefcdab89;
  local_88.state[2] = 0x98badcfe;
  local_88.state[3] = 0x10325476;
  local_88.state[4] = 0xc3d2e1f0;
  memzero(local_88.buffer,0x40);
  local_88.bitcount = 0;
  sha1_Update(&local_88,data,len);
  pcVar1 = sha1_End(&local_88,digest);
  return pcVar1;
}

Assistant:

char* sha1_Data(const sha2_byte* data, size_t len, char digest[SHA1_DIGEST_STRING_LENGTH]) {
    trezor::SHA1_CTX	context;

	sha1_Init(&context);
	sha1_Update(&context, data, len);
	return sha1_End(&context, digest);
}